

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

bool __thiscall CLOptions::ParseCommandLine(CLOptions *this,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *this_00;
  CLOptions *this_01;
  allocator local_161;
  int local_160;
  int option_index;
  char **local_158;
  string opt_name;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  short_to_long_map;
  string short_opts;
  string opt_val;
  string local_c0;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string local_50;
  
  local_160 = argc;
  local_158 = argv;
  DefineParams(this);
  if ((this->configfile_opt_name)._M_string_length != 0) {
    do {
      do {
        short_opts._M_dataplus._M_p._0_4_ = 0xffffffff;
        iVar2 = getopt_long_only(local_160,local_158,"",
                                 (this->longopts).
                                 super__Vector_base<option,_std::allocator<option>_>._M_impl.
                                 super__Vector_impl_data._M_start,&short_opts);
      } while (iVar2 == 0);
      if (iVar2 == -1) {
        std::__cxx11::string::string((string *)&local_a0,(string *)&this->configfile_opt_name);
        operator[]((string *)&short_to_long_map,this,&local_a0);
        std::__cxx11::string::~string((string *)&short_to_long_map);
        std::__cxx11::string::~string((string *)&local_a0);
        if (short_to_long_map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ == 0)
        goto LAB_0010a71f;
        std::__cxx11::string::string((string *)&local_c0,(string *)&this->configfile_opt_name);
        operator[]((string *)&short_to_long_map,this,&local_c0);
        bVar1 = FillFromFile(this,(string *)&short_to_long_map);
        std::__cxx11::string::~string((string *)&short_to_long_map);
        this_00 = &local_c0;
        goto LAB_0010a70e;
      }
      std::__cxx11::string::string
                ((string *)&short_to_long_map,
                 (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)short_opts._M_dataplus._M_p].name,
                 (allocator *)&opt_name);
      iVar2 = std::__cxx11::string::compare((string *)&short_to_long_map);
      std::__cxx11::string::~string((string *)&short_to_long_map);
    } while (iVar2 != 0);
    std::__cxx11::string::string((string *)&short_to_long_map,_optarg,(allocator *)&opt_name);
    bVar1 = FillFromFile(this,(string *)&short_to_long_map);
    this_00 = (string *)&short_to_long_map;
LAB_0010a70e:
    std::__cxx11::string::~string((string *)this_00);
    if (bVar1 != false) {
      return true;
    }
  }
LAB_0010a71f:
  _optind = 0;
  short_opts._M_dataplus._M_p = (pointer)&short_opts.field_2;
  short_opts._M_string_length = 0;
  short_opts.field_2._M_local_buf[0] = '\0';
  GetShortOpts(&short_to_long_map,this,&short_opts);
  while( true ) {
    do {
      option_index = -1;
      iVar2 = getopt_long(local_160,local_158,short_opts._M_dataplus._M_p,
                          (this->longopts).super__Vector_base<option,_std::allocator<option>_>.
                          _M_impl.super__Vector_impl_data._M_start,&option_index);
    } while (iVar2 == 0);
    if (iVar2 == -1) {
      bVar1 = false;
      goto LAB_0010a8ee;
    }
    if (iVar2 == 0x3f) goto LAB_0010a8eb;
    if (iVar2 == 0x68) {
      std::__cxx11::string::string((string *)&opt_name,*local_158,(allocator *)&opt_val);
      PrintHelp(this,&opt_name);
      goto LAB_0010a8e1;
    }
    if (iVar2 == 0x76) break;
    opt_name._M_dataplus._M_p = (pointer)&opt_name.field_2;
    opt_name._M_string_length = 0;
    opt_name.field_2._M_local_buf[0] = '\0';
    if (option_index < 0) {
      opt_val._M_dataplus._M_p._0_4_ = (int)(char)iVar2;
      std::
      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&short_to_long_map,(key_type *)&opt_val);
      std::__cxx11::string::_M_assign((string *)&opt_name);
    }
    else {
      std::__cxx11::string::assign((char *)&opt_name);
    }
    std::__cxx11::string::string((string *)&opt_val,_optarg,(allocator *)&local_50);
    std::__cxx11::string::string((string *)&local_50,_optarg,&local_161);
    CLOptionsHelper::split(&values,&local_50,' ');
    std::__cxx11::string::~string((string *)&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_80,&values);
    SetParam(this,&opt_name,&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&values);
    std::__cxx11::string::~string((string *)&opt_val);
    std::__cxx11::string::~string((string *)&opt_name);
  }
  this_01 = (CLOptions *)&opt_name;
  std::__cxx11::string::string
            ((string *)this_01,
             (string *)
             &(this->version_opt).
              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .value);
  PrintDescription(this_01,&opt_name,0);
LAB_0010a8e1:
  std::__cxx11::string::~string((string *)&opt_name);
LAB_0010a8eb:
  bVar1 = true;
LAB_0010a8ee:
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&short_to_long_map._M_t);
  std::__cxx11::string::~string((string *)&short_opts);
  return bVar1;
}

Assistant:

bool CLOptions::ParseCommandLine(int argc, char** argv)
{
    // Establish the actual parameters
    DefineParams() ;

    // If we've defined a configuration file parameter, do a pre-loop to see if
    // the user has passed that parameter
    if (configfile_opt_name.size() > 0) {
        // Loop until we find the config file name
        bool use_default_configfile(true) ;
        while(1) {
            int c(0), options_index(-1) ;
            
            c = getopt_long_only(argc, argv, "",
                                 &longopts[0], &options_index) ;
            if (c==-1) break;
            if (c==0) continue ;
            if (std::string(longopts[options_index].name).compare(configfile_opt_name)==0) {
                if (FillFromFile(optarg)) return true ;
                use_default_configfile = false ;
                break ;
            }
        }
        // If the config file info wasnt filled AND if the default filename isnt empty
        // fill the config options from the default file
        if ((use_default_configfile)&&(!(*this)[configfile_opt_name].empty())) {
            if (FillFromFile((*this)[configfile_opt_name])) return true ;
        }
    }
    
    // Reset the option index so that we can start over filling the options
    // that were passed on the command line
    optind = 0 ;
    
    std::string short_opts ;
    std::map<int, std::string> short_to_long_map = GetShortOpts(short_opts) ;

    // Loop through all the passed options
    while (1)
    {
        int c(0) ;

        /* getopt_long stores the option index here. */
        int option_index = -1;
                
        // If short form options were given, then enforce the "double-dash" policy
        // for long options
        c = getopt_long (argc, argv, short_opts.c_str(),
                         &longopts[0], &option_index);
        
        /* Detect the end of the options. */
        if (c == -1) break;
        
        // Now loop through all of the options to fill them based on their values
        switch (c)
        {
            case 0:
                /* If this option set a flag, do nothing else now. */
                break;
            case 'h':
                // Print the help message and quit
                PrintHelp(argv[0]) ;
                return true ;
            case 'v':
                // Print the version information
                PrintDescription(version_opt.getValue(), 0) ;
                return true ;
            case '?':
                // getopt_long already printed an error message. This will
                // most typically happen when an unrecognized option has 
                // been passed, or when an option expecting an argument 
                // was not given one on the commandline.
                return true ;
            default:
                // We have found an option, so get the option name
                std::string opt_name ;
                if (option_index >= 0) {
                    // The long form of the name was supplied
                    opt_name = longopts[option_index].name ;
                } else {
                    // The short form of the name was supplied
                    char c_char(c) ;
                    opt_name = short_to_long_map[c_char] ;
                }
                std::string opt_val ( optarg ) ;
                std::vector<std::string> values = CLOptionsHelper::split( optarg, ' ') ;
                SetParam(opt_name, values) ;
                
                break ;
        }
    }
    // Note that it is up to the user to handle conflicts between parameters
    return false ;
}